

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O0

void testAttrFloatVectors(string *tempdir)

{
  exr_context_t f;
  char *in_stack_00000070;
  exr_context_t in_stack_00000180;
  exr_context_t local_10 [2];
  
  local_10[0] = createDummyFile(in_stack_00000070);
  testFloatVectorHelper(in_stack_00000180);
  exr_print_context_info(local_10[0],0);
  exr_print_context_info(local_10[0],1);
  exr_finish(local_10);
  return;
}

Assistant:

void
testAttrFloatVectors (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testFloatVectorHelper (NULL);
    exr_context_t f = createDummyFile ("<floatvector>");
    testFloatVectorHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}